

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_enum.c
# Opt level: O3

upb_MiniTableEnum *
upb_MtDecoder_BuildMiniTableEnum(upb_MdEnumDecoder *decoder,char *data,size_t len)

{
  byte bVar1;
  int iVar2;
  upb_MiniTableEnum *puVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar7;
  uint val;
  char *pcVar8;
  byte *pbVar9;
  uint uVar10;
  
  iVar2 = __sigsetjmp((decoder->base).err,0);
  if (iVar2 == 0) {
    if (len != 0) {
      uVar6 = (uint)*data;
      if (uVar6 != 0x21) {
        pcVar8 = "Invalid enum version: %c";
LAB_00289433:
        upb_MdDecoder_ErrorJmp(&decoder->base,pcVar8,(ulong)uVar6);
      }
      data = data + 1;
    }
    if (decoder->enum_table == (upb_MiniTableEnum *)0x0) {
      pcVar8 = "Out of memory";
LAB_00289401:
      upb_MdDecoder_ErrorJmp(&decoder->base,pcVar8);
    }
    decoder->enum_table->mask_limit_dont_copy_me__upb_internal_use_only = 0x40;
    val = 0;
    puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,0);
    decoder->enum_table = puVar3;
    puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,0);
    decoder->enum_table = puVar3;
    puVar3->value_count_dont_copy_me__upb_internal_use_only = 0;
    pbVar7 = (byte *)(decoder->base).end;
    if (data < pbVar7) {
      do {
        bVar1 = *data;
        data = (char *)((byte *)data + 1);
        uVar6 = (uint)(char)bVar1;
        uVar5 = (long)(char)bVar1 & 0xffffffff;
        if ((long)(char)bVar1 < 0x42) {
          uVar6 = 0xffffffff;
          if (0xa0 < (byte)(bVar1 + 0x81)) {
            uVar6 = (uint)""[(int)(char)bVar1 - 0x20];
          }
          uVar5 = (ulong)uVar6;
          iVar2 = 0;
          do {
            if ((uVar5 & 1) != 0) {
              puVar3 = decoder->enum_table;
              uVar6 = decoder->enum_value_count + 1;
              decoder->enum_value_count = uVar6;
              if (puVar3->value_count_dont_copy_me__upb_internal_use_only == 0) {
                uVar4 = puVar3->mask_limit_dont_copy_me__upb_internal_use_only;
                if (val >> 5 <= uVar6 || val < 0x201) {
                  while (uVar4 < (val & 0xffffffe0) + 0x20) {
                    puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,0);
                    uVar4 = puVar3->mask_limit_dont_copy_me__upb_internal_use_only + 0x20;
                    puVar3->mask_limit_dont_copy_me__upb_internal_use_only = uVar4;
                  }
                  (&puVar3[1].mask_limit_dont_copy_me__upb_internal_use_only)[val >> 5] =
                       (&puVar3[1].mask_limit_dont_copy_me__upb_internal_use_only)[val >> 5] |
                       1 << ((byte)val & 0x1f);
                  goto LAB_002892c6;
                }
                if (decoder->enum_data_count != uVar4 >> 5) {
                  __assert_fail("d->enum_data_count == table->mask_limit_dont_copy_me__upb_internal_use_only / 32"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/build_enum.c"
                                ,0x40,
                                "void upb_MiniTableEnum_BuildValue(upb_MdEnumDecoder *, uint32_t)");
                }
              }
              puVar3 = _upb_MiniTable_AddEnumDataMember(decoder,val);
              puVar3->value_count_dont_copy_me__upb_internal_use_only =
                   puVar3->value_count_dont_copy_me__upb_internal_use_only + 1;
            }
LAB_002892c6:
            iVar2 = iVar2 + 1;
            val = val + 1;
            uVar5 = uVar5 >> 1;
          } while (iVar2 != 5);
          pbVar7 = (byte *)(decoder->base).end;
        }
        else {
          if (0x1f < (byte)(bVar1 + 0xa1)) {
            pcVar8 = "Unexpected character: %c";
            goto LAB_00289433;
          }
          for (uVar6 = 0x1f; 0x1eU >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
          uVar10 = 0;
          pbVar9 = (byte *)data;
          uVar4 = uVar10;
          while ((uVar10 = ""[((uint)uVar5 & 0xff) - 0x20] + -0x3c << ((byte)uVar4 & 0x1f) | uVar10,
                 data = (char *)pbVar7, pbVar9 != pbVar7 &&
                 (uVar5 = (ulong)*pbVar9, data = (char *)pbVar9, 0xdf < (byte)(*pbVar9 + 0x81)))) {
            pbVar9 = pbVar9 + 1;
            uVar4 = uVar4 + (uVar6 ^ 0xffffffe0) + 0x21;
            if (0x1f < uVar4) {
              pcVar8 = "Overlong varint";
              goto LAB_00289401;
            }
          }
          val = uVar10 + val;
        }
      } while (data < pbVar7);
      puVar3 = decoder->enum_table;
    }
  }
  else {
    puVar3 = (upb_MiniTableEnum *)0x0;
  }
  return puVar3;
}

Assistant:

static upb_MiniTableEnum* upb_MtDecoder_BuildMiniTableEnum(
    upb_MdEnumDecoder* const decoder, const char* const data,
    size_t const len) {
  if (UPB_SETJMP(decoder->base.err) != 0) return NULL;
  return upb_MtDecoder_DoBuildMiniTableEnum(decoder, data, len);
}